

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcGlyphAttrMatrix.h
# Opt level: O0

bool __thiscall
GrcGlyphAttrMatrix::DefinedButMaybeShadow
          (GrcGlyphAttrMatrix *this,gid16 wGlyphID,int nAttrID,bool *pfShadow,int nStyle)

{
  GrcAssignment *pGVar1;
  int iVar2;
  GdlExpression *pGVar3;
  byte *in_RCX;
  uint in_EDX;
  gid16 in_SI;
  GrcGlyphAttrMatrix *in_RDI;
  uint in_R8D;
  GrcAssignment *pasgnx;
  bool local_1;
  
  if (((in_RDI->m_cGlyphAttrs == 0) || (in_RDI->m_cGlyphIDs == 0)) || (in_RDI->m_cStyles == 0)) {
    local_1 = false;
  }
  else {
    pGVar1 = in_RDI->m_prgasgnx;
    iVar2 = Index(in_RDI,in_SI,in_EDX,in_R8D);
    *in_RCX = pGVar1[iVar2].m_fShadow & 1;
    pGVar3 = GrcAssignment::Expression(pGVar1 + iVar2);
    local_1 = pGVar3 != (GdlExpression *)0x0;
  }
  return local_1;
}

Assistant:

bool DefinedButMaybeShadow(gid16 wGlyphID, int nAttrID, bool *pfShadow, int nStyle = 0)
	{
		if (m_cGlyphAttrs == 0 || m_cGlyphIDs == 0 || m_cStyles == 0)
			return false;
		GrcAssignment * pasgnx = m_prgasgnx + Index(wGlyphID, nAttrID, nStyle);
		*pfShadow = pasgnx->m_fShadow;
		return (pasgnx->Expression());
	}